

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

void __thiscall wasm::TypeUpdater::propagateTypesUp(TypeUpdater *this,Expression *curr)

{
  Id IVar1;
  uintptr_t uVar2;
  mapped_type *ppEVar3;
  Expression **ppEVar4;
  mapped_type *pmVar5;
  Try **ppTVar6;
  Type old;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  Try *local_38;
  Expression *child;
  
  if ((curr->type).id == 1) {
LAB_009ce473:
    do {
      ppTVar6 = &local_38;
      local_38 = (Try *)curr;
      ppEVar3 = std::
                map<wasm::Expression_*,_wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
                ::operator[](&this->parents,(key_type *)&local_38);
      curr = *ppEVar3;
      if ((Try *)curr == (Try *)0x0) {
        return;
      }
      uVar2 = (((Try *)curr)->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
              type.id;
      if (uVar2 == 1) {
        return;
      }
      IVar1 = (((Try *)curr)->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
              _id;
      if (IVar1 == TryId) {
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)ppTVar6;
        Try::finalize((Try *)curr,type__00);
      }
      else {
        if (IVar1 != IfId) {
          if (IVar1 == BlockId) {
            ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)&((Try *)curr)->body);
            if (1 < ((*ppEVar4)->type).id) {
              return;
            }
            if (((((Try *)curr)->name).super_IString.str._M_str != (char *)0x0) &&
               (pmVar5 = std::
                         map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
                         ::operator[](&this->blockInfos,&((Try *)curr)->name),
               pmVar5->numBreaks != 0)) {
              return;
            }
          }
          (((Try *)curr)->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.
          id = 1;
          goto LAB_009ce473;
        }
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)ppTVar6;
        If::finalize((If *)curr,type_);
      }
    } while ((((Try *)curr)->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.
             type.id == 1);
    (((Try *)curr)->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression.type.id =
         uVar2;
  }
  return;
}

Assistant:

bool operator!=(const BasicType& other) const { return id != other; }